

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O0

void __thiscall filenames_GetBasename_Test::TestBody(filenames_GetBasename_Test *this)

{
  char *in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view filename_06;
  string_view filename_07;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  string_view local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  string_view local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  string_view local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  string_view local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  string_view local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  string_view local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string_view local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string_view local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  string_view local_20;
  filenames_GetBasename_Test *local_10;
  filenames_GetBasename_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"/bar/dir/foo.txt");
  filename._M_str = extraout_RDX;
  filename._M_len = (size_t)local_30._M_str;
  local_20 = wabt::GetBasename((wabt *)local_30._M_len,filename);
  sv._M_str = in_RCX;
  sv._M_len = (size_t)local_20._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x30eda9,(char *)local_20._M_len,sv);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"bar/dir/foo.txt");
  filename_00._M_str = extraout_RDX_00;
  filename_00._M_len = (size_t)local_50._M_str;
  local_40 = wabt::GetBasename((wabt *)local_50._M_len,filename_00);
  sv_00._M_str = in_RCX;
  sv_00._M_len = (size_t)local_40._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x30eda9,(char *)local_40._M_len,sv_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"/foo.txt");
  filename_01._M_str = extraout_RDX_01;
  filename_01._M_len = (size_t)local_70._M_str;
  local_60 = wabt::GetBasename((wabt *)local_70._M_len,filename_01);
  sv_01._M_str = in_RCX;
  sv_01._M_len = (size_t)local_60._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x30eda9,(char *)local_60._M_len,sv_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"\\bar\\dir\\foo.txt");
  filename_02._M_str = extraout_RDX_02;
  filename_02._M_len = (size_t)local_90._M_str;
  local_80 = wabt::GetBasename((wabt *)local_90._M_len,filename_02);
  sv_02._M_str = in_RCX;
  sv_02._M_len = (size_t)local_80._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x30eda9,(char *)local_80._M_len,sv_02);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"bar\\dir\\foo.txt");
  filename_03._M_str = extraout_RDX_03;
  filename_03._M_len = (size_t)local_b0._M_str;
  local_a0 = wabt::GetBasename((wabt *)local_b0._M_len,filename_03);
  sv_03._M_str = in_RCX;
  sv_03._M_len = (size_t)local_a0._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x30eda9,(char *)local_a0._M_len,sv_03);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"\\foo.txt");
  filename_04._M_str = extraout_RDX_04;
  filename_04._M_len = (size_t)local_d0._M_str;
  local_c0 = wabt::GetBasename((wabt *)local_d0._M_len,filename_04);
  sv_04._M_str = in_RCX;
  sv_04._M_len = (size_t)local_c0._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x30eda9,(char *)local_c0._M_len,sv_04);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"foo.txt");
  filename_05._M_str = extraout_RDX_05;
  filename_05._M_len = (size_t)local_f0._M_str;
  local_e0 = wabt::GetBasename((wabt *)local_f0._M_len,filename_05);
  sv_05._M_str = in_RCX;
  sv_05._M_len = (size_t)local_e0._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x30eda9,(char *)local_e0._M_len,sv_05);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"foo");
  filename_06._M_str = extraout_RDX_06;
  filename_06._M_len = (size_t)local_110._M_str;
  local_100 = wabt::GetBasename((wabt *)local_110._M_len,filename_06);
  sv_06._M_str = in_RCX;
  sv_06._M_len = (size_t)local_100._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x31c421,(char *)local_100._M_len,sv_06);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"");
  filename_07._M_str = extraout_RDX_07;
  filename_07._M_len = (size_t)local_130._M_str;
  local_120 = wabt::GetBasename((wabt *)local_130._M_len,filename_07);
  sv_07._M_str = in_RCX;
  sv_07._M_len = (size_t)local_120._M_str;
  anon_unknown.dwarf_8e596::assert_string_view_eq
            ((anon_unknown_dwarf_8e596 *)0x31180a,(char *)local_120._M_len,sv_07);
  return;
}

Assistant:

TEST(filenames, GetBasename) {
  assert_string_view_eq("foo.txt", GetBasename("/bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("foo.txt"));
  assert_string_view_eq("foo", GetBasename("foo"));
  assert_string_view_eq("", GetBasename(""));
}